

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSavable.h
# Opt level: O0

TPZSavable * __thiscall
TPZRestoreClass<TPZCompElKernelHDiv3D<pzshape::TPZShapeTetra>_>::Restore
          (TPZRestoreClass<TPZCompElKernelHDiv3D<pzshape::TPZShapeTetra>_> *this)

{
  long *plVar1;
  TPZCompElKernelHDiv3D<pzshape::TPZShapeTetra> *ptr;
  undefined8 local_30;
  TPZCompElKernelHDiv3D<pzshape::TPZShapeTetra> *in_stack_ffffffffffffffe0;
  
  plVar1 = (long *)operator_new(200);
  TPZCompElKernelHDiv3D<pzshape::TPZShapeTetra>::TPZCompElKernelHDiv3D(in_stack_ffffffffffffffe0);
  local_30 = (TPZSavable *)0x0;
  if (plVar1 != (long *)0x0) {
    local_30 = (TPZSavable *)((long)plVar1 + *(long *)(*plVar1 + -0x60));
  }
  return local_30;
}

Assistant:

virtual TPZSavable *Restore() override {
        T *ptr = new T;
        return ptr;
    }